

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ZSTD_compressionParameters cParams;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  undefined4 local_4c;
  undefined4 uStack_48;
  
  uVar1 = (params->cParams).searchLog;
  uVar5 = (params->cParams).windowLog;
  uVar6 = (params->cParams).chainLog;
  uVar7 = (params->cParams).hashLog;
  cParams.hashLog = uVar7;
  cParams.chainLog = uVar6;
  cParams.windowLog = uVar5;
  uVar2 = (params->cParams).minMatch;
  uVar3 = (params->cParams).targetLength;
  uVar4 = (params->cParams).strategy;
  cParams.strategy = uVar4;
  cParams.targetLength = uVar3;
  cParams.searchLog = uVar1;
  cParams.minMatch = uVar2;
  sVar8 = ZSTD_checkCParams(cParams);
  if (sVar8 < 0xffffffffffffff89) {
    sVar8 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,params,pledgedSrcSize,
                       ZSTDb_not_buffered);
  }
  return sVar8;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) , "");
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}